

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linear_workflow.cpp
# Opt level: O2

float __thiscall ON_LinearWorkflow::PostProcessGamma(ON_LinearWorkflow *this)

{
  ON_InternalXMLImpl *this_00;
  float fVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  this_00 = &this->_impl->super_ON_InternalXMLImpl;
  ::ON_XMLVariant::ON_XMLVariant(&local_108,2.2);
  ON_InternalXMLImpl::GetParameter
            (&local_200,this_00,L"render-content-manager-document/settings/rendering",L"gamma",
             &local_108);
  fVar1 = ::ON_XMLVariant::operator_cast_to_float(&local_200);
  if (fVar1 <= 0.2) {
    fVar1 = 0.2;
  }
  if (5.0 <= fVar1) {
    fVar1 = 5.0;
  }
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return fVar1;
}

Assistant:

float ON_LinearWorkflow::PostProcessGamma(void) const
{
  return ClampGamma(_impl->GetParameter(XMLPath(), ON_RDK_POST_PROCESS_GAMMA, 2.2f));
}